

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

bool __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator==
          (Roaring64MapSetBitBiDirectionalIterator *this,Roaring64MapSetBitBiDirectionalIterator *o)

{
  bool bVar1;
  _Self *__x;
  Roaring64MapSetBitBiDirectionalIterator *this_00;
  Roaring64MapSetBitBiDirectionalIterator *pRVar2;
  long in_RSI;
  long in_RDI;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_stack_ffffffffffffff98;
  Roaring64MapSetBitBiDirectionalIterator *in_stack_ffffffffffffffa0;
  bool local_31;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  long local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::cend(in_stack_ffffffffffffff98);
  bVar1 = std::operator==((_Self *)(in_RDI + 8),&local_20);
  local_31 = false;
  if (bVar1) {
    __x = (_Self *)(local_18 + 8);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::cend(in_stack_ffffffffffffff98);
    local_31 = std::operator==(__x,&local_28);
  }
  if (local_31 == false) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::cend(in_stack_ffffffffffffff98);
    bVar1 = std::operator==((_Self *)(local_18 + 8),&local_30);
    if (bVar1) {
      local_1 = false;
    }
    else {
      this_00 = (Roaring64MapSetBitBiDirectionalIterator *)operator*(in_stack_ffffffffffffffa0);
      pRVar2 = (Roaring64MapSetBitBiDirectionalIterator *)operator*(this_00);
      local_1 = this_00 == pRVar2;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool operator==(const Roaring64MapSetBitBiDirectionalIterator &o) const {
        if (map_iter == p->cend() && o.map_iter == o.p->cend()) return true;
        if (o.map_iter == o.p->cend()) return false;
        return **this == *o;
    }